

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_Test::testBody
          (TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_Test *this)

{
  MemoryLeakDetector *pMVar1;
  bool bVar2;
  TestMemoryAllocator *pTVar3;
  char *pcVar4;
  char *pcVar5;
  UtestShell *pUVar6;
  size_t sVar7;
  TestTerminator *pTVar8;
  SimpleString SStack_48;
  SimpleString output;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar3 = defaultNewAllocator();
  pcVar4 = MemoryLeakDetector::allocMemory(pMVar1,pTVar3,4,false);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar3 = defaultNewAllocator();
  pcVar5 = MemoryLeakDetector::allocMemory(pMVar1,pTVar3,0xc,false);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar3 = defaultNewAllocator();
  MemoryLeakDetector::deallocMemory(pMVar1,pTVar3,pcVar5,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pcVar5 = MemoryLeakDetector::report
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      mem_leak_period_checking);
  SimpleString::SimpleString(&output,pcVar5);
  pUVar6 = UtestShell::getCurrent();
  sVar7 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_checking);
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[0xe])
            (pUVar6,1,sVar7,
             "LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x104,pTVar8);
  pUVar6 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_48,"size: 12");
  bVar2 = SimpleString::contains(&output,&SStack_48);
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[8])
            (pUVar6,(ulong)!bVar2,"CHECK","!output.contains(\"size: 12\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x105,pTVar8);
  SimpleString::~SimpleString(&SStack_48);
  pUVar6 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_48,"size: 4");
  bVar2 = SimpleString::contains(&output,&SStack_48);
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[8])
            (pUVar6,(ulong)bVar2,"CHECK","output.contains(\"size: 4\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x106,pTVar8);
  SimpleString::~SimpleString(&SStack_48);
  (*PlatformSpecificFree)(pcVar4);
  SimpleString::~SimpleString(&output);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, TwoAllocOneFreeOneLeakReverseOrder)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    char* mem2 = detector->allocMemory(defaultNewAllocator(), 12);
    detector->deallocMemory(defaultNewAllocator(), mem2);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    CHECK(!output.contains("size: 12"));
    CHECK(output.contains("size: 4"));
    PlatformSpecificFree(mem);
}